

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O2

rf_int rf_get_pkm_image_size(void *src,rf_int src_size)

{
  _Bool _Var1;
  ulong uVar2;
  long in_FS_OFFSET;
  undefined8 local_48;
  undefined8 uStack_40;
  char *local_38;
  char *pcStack_30;
  undefined8 local_28;
  
  if ((ulong)src_size < 0x11 || src == (void *)0x0) {
    uVar2 = 0;
  }
  else {
    local_48 = *src;
    uStack_40 = *(undefined8 *)((long)src + 8);
    _Var1 = rf_match_str_cstr((char *)&local_48,4,"PKM ");
    if (_Var1) {
      uVar2 = (ulong)(((uint)(ushort)(uStack_40._2_2_ << 8 | uStack_40._2_2_ >> 8) *
                       (uint)(ushort)((ushort)uStack_40 << 8 | (ushort)uStack_40 >> 8) <<
                      (local_48._6_2_ == 0x300 | 2U)) >> 3);
    }
    else {
      local_38 = 
      "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      pcStack_30 = "rf_get_pkm_image_size";
      local_28 = 0x45a6;
      uVar2 = 0;
      rf_log_impl(8,0x17349b,(char *)0x5);
      *(char **)(in_FS_OFFSET + -0x450) =
           "/workspace/llm4binary/github/license_c_cmakelists/SasLuca[P]rayfork-sokol-template/libs/rayfork/rayfork.c"
      ;
      *(char **)(in_FS_OFFSET + -0x448) = "rf_get_pkm_image_size";
      *(undefined8 *)(in_FS_OFFSET + -0x440) = 0x45a6;
      *(undefined4 *)(in_FS_OFFSET + -0x438) = 5;
    }
  }
  return uVar2;
}

Assistant:

RF_API rf_int rf_get_pkm_image_size(const void* src, rf_int src_size)
{
    int result = 0;

    if (src && src_size > sizeof(rf_pkm_header))
    {
        rf_pkm_header header = *(rf_pkm_header*)src;

        // Verify the type of file
        if (rf_match_str_cstr(header.id, sizeof(header.id), "PKM "))
        {
            // Note: format, width and height come as big-endian, data must be swapped to little-endian
            header.format = ((header.format & 0x00FF) << 8) | ((header.format & 0xFF00) >> 8);
            header.width  = ((header.width  & 0x00FF) << 8) | ((header.width  & 0xFF00) >> 8);
            header.height = ((header.height & 0x00FF) << 8) | ((header.height & 0xFF00) >> 8);

            int bpp = 4;
            if (header.format == 3) bpp = 8;

            result = header.width * header.height * bpp / 8;
        }
        else RF_LOG_ERROR(RF_BAD_FORMAT, "PKM file does not seem to be a valid image");
    }

    return result;
}